

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gia.h
# Opt level: O2

int Cbs_VarIsJust(Gia_Obj_t *pVar)

{
  ulong uVar1;
  uint uVar2;
  
  uVar1 = *(ulong *)pVar;
  uVar2 = 0;
  if (((uVar1 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar1) &&
     ((pVar[-(uVar1 & 0x1fffffff)].field_0x3 & 0x40) == 0)) {
    uVar2 = (uint)((*(uint *)(pVar + -(ulong)((uint)(uVar1 >> 0x20) & 0x1fffffff)) >> 0x1e & 1) == 0
                  );
  }
  return uVar2;
}

Assistant:

static inline int          Gia_ObjIsAnd( Gia_Obj_t * pObj )                    { return!pObj->fTerm && pObj->iDiff0 != GIA_NONE; }